

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O1

CURLcode Curl_build_unencoding_stack(Curl_easy *data,char *enclist,int maybechunked)

{
  undefined1 *puVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  contenc_writer *pcVar5;
  size_t sVar6;
  content_encoding **ppcVar7;
  size_t max;
  content_encoding *ce;
  content_encoding *pcVar8;
  byte *pbVar9;
  content_encoding *handler;
  
  do {
    while( true ) {
      handler = (content_encoding *)(ulong)(uint)maybechunked;
      iVar4 = Curl_isspace((uint)(byte)*enclist);
      if ((iVar4 == 0) && (*enclist != 0x2c)) break;
      enclist = (char *)((byte *)enclist + 1);
    }
    sVar6 = 1;
    max = 0;
    for (pbVar9 = (byte *)enclist; (bVar2 = *pbVar9, bVar2 != 0 && (bVar2 != 0x2c));
        pbVar9 = pbVar9 + 1) {
      iVar4 = Curl_isspace((uint)bVar2);
      if (iVar4 == 0) {
        max = sVar6;
      }
      sVar6 = sVar6 + 1;
    }
    if (((maybechunked == 0) || (max != 7)) ||
       (iVar4 = Curl_strncasecompare(enclist,"chunked",7), iVar4 == 0)) {
      if (max != 0) {
        ppcVar7 = encodings;
        pcVar8 = &identity_encoding;
        do {
          ppcVar7 = ppcVar7 + 1;
          iVar4 = Curl_strncasecompare(enclist,pcVar8->name,max);
          if (((iVar4 == 0) || (pcVar8->name[max] != '\0')) &&
             ((pcVar8->alias == (char *)0x0 ||
              ((iVar4 = Curl_strncasecompare(enclist,pcVar8->alias,max), iVar4 == 0 ||
               (pcVar8->alias[max] != '\0')))))) {
            bVar3 = true;
          }
          else {
            bVar3 = false;
            handler = pcVar8;
          }
          if (!bVar3) goto LAB_0011071e;
          pcVar8 = *ppcVar7;
        } while (pcVar8 != (content_encoding *)0x0);
        handler = (content_encoding *)0x0;
LAB_0011071e:
        if ((data->req).writer_stack == (contenc_writer *)0x0) {
          pcVar5 = new_unencoding_writer(data,&client_encoding,(contenc_writer *)0x0);
          (data->req).writer_stack = pcVar5;
          if (pcVar5 == (contenc_writer *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
        }
        if (handler == (content_encoding *)0x0) {
          handler = &error_encoding;
        }
        pcVar5 = new_unencoding_writer(data,handler,(data->req).writer_stack);
        if (pcVar5 == (contenc_writer *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        (data->req).writer_stack = pcVar5;
      }
    }
    else {
      puVar1 = &(data->req).field_0xd8;
      *puVar1 = *puVar1 | 0x20;
      Curl_httpchunk_init(data);
    }
    enclist = (char *)pbVar9;
    if (*pbVar9 == 0) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_build_unencoding_stack(struct Curl_easy *data,
                                     const char *enclist, int maybechunked)
{
  struct SingleRequest *k = &data->req;

  do {
    const char *name;
    size_t namelen;

    /* Parse a single encoding name. */
    while(ISSPACE(*enclist) || *enclist == ',')
      enclist++;

    name = enclist;

    for(namelen = 0; *enclist && *enclist != ','; enclist++)
      if(!ISSPACE(*enclist))
        namelen = enclist - name + 1;

    /* Special case: chunked encoding is handled at the reader level. */
    if(maybechunked && namelen == 7 && strncasecompare(name, "chunked", 7)) {
      k->chunk = TRUE;             /* chunks coming our way. */
      Curl_httpchunk_init(data);   /* init our chunky engine. */
    }
    else if(namelen) {
      const struct content_encoding *encoding = find_encoding(name, namelen);
      struct contenc_writer *writer;

      if(!k->writer_stack) {
        k->writer_stack = new_unencoding_writer(data, &client_encoding, NULL);

        if(!k->writer_stack)
          return CURLE_OUT_OF_MEMORY;
      }

      if(!encoding)
        encoding = &error_encoding;  /* Defer error at stack use. */

      /* Stack the unencoding stage. */
      writer = new_unencoding_writer(data, encoding, k->writer_stack);
      if(!writer)
        return CURLE_OUT_OF_MEMORY;
      k->writer_stack = writer;
    }
  } while(*enclist);

  return CURLE_OK;
}